

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O2

void emit_mrm(ASMState *as,x86Op xo,Reg rr,Reg rb)

{
  int iVar1;
  MCode *pMVar2;
  byte *pbVar3;
  uint uVar4;
  char cVar5;
  byte bVar6;
  
  pMVar2 = as->mcp;
  cVar5 = -0x40;
  if (rb == 0x20) {
    bVar6 = (as->mrm).base;
    rb = (Reg)bVar6;
    if (bVar6 == 0x25) {
      *(int32_t *)(pMVar2 + -4) = (as->mrm).ofs;
      pMVar2 = pMVar2 + -4;
      cVar5 = '\0';
      rb = 0x25;
      goto LAB_0013dcf6;
    }
    if (bVar6 == 0x80) {
      *(int32_t *)(pMVar2 + -4) = (as->mrm).ofs;
      bVar6 = (as->mrm).idx;
      if (bVar6 == 0x80) {
        pMVar2[-5] = '%';
        pMVar2 = pMVar2 + -5;
        cVar5 = '\0';
        rb = 4;
        goto LAB_0013dcf6;
      }
      pMVar2 = pMVar2 + -4;
      cVar5 = '\0';
      rb = 5;
    }
    else {
      iVar1 = (as->mrm).ofs;
      cVar5 = '\0';
      if ((rb & 7) == 5 || iVar1 != 0) {
        if ((char)(MCode)iVar1 == iVar1) {
          pMVar2[-1] = (MCode)iVar1;
          pMVar2 = pMVar2 + -1;
          cVar5 = '@';
        }
        else {
          *(int *)(pMVar2 + -4) = iVar1;
          pMVar2 = pMVar2 + -4;
          cVar5 = -0x80;
        }
      }
      bVar6 = (as->mrm).idx;
      if (bVar6 == 0x80) {
        if ((rb & 7) == 4) {
          pMVar2[-1] = '$';
          pMVar2 = pMVar2 + -1;
        }
        goto LAB_0013dcf6;
      }
    }
    pMVar2[-1] = ((byte)rb & 7) + (as->mrm).scale + (bVar6 & 7) * '\b';
    pMVar2[-2] = cVar5 + ((byte)rr & 7) * '\b' + '\x04';
    bVar6 = (as->mrm).idx;
    if (xo << 0x18 == -0x3c000000) {
      *(x86Op *)(pMVar2 + -6) = (rb >> 3 & 1 | bVar6 >> 2 & 2 | rr >> 1 & 4) << 0xd ^ xo;
      pbVar3 = pMVar2 + -6;
      goto LAB_0013ded9;
    }
    *(x86Op *)(pMVar2 + -6) = xo;
    pbVar3 = pMVar2 + (long)((int)(xo << 0x18) >> 0x18) + -1;
    uVar4 = rb >> 3 & 1 | rr >> 1 & 0x104 | bVar6 >> 2 & 2;
    if (uVar4 == 0) goto LAB_0013ded9;
    bVar6 = (byte)uVar4;
  }
  else {
LAB_0013dcf6:
    pMVar2[-1] = ((byte)rb & 7) + ((byte)rr & 7) * '\b' + cVar5;
    if (xo << 0x18 == -0x3c000000) {
      *(x86Op *)(pMVar2 + -5) = (rb >> 3 & 1 | rr >> 1 & 4) << 0xd ^ xo;
      pbVar3 = pMVar2 + -5;
      goto LAB_0013ded9;
    }
    *(x86Op *)(pMVar2 + -5) = xo;
    pbVar3 = pMVar2 + ((int)(xo << 0x18) >> 0x18);
    uVar4 = rb >> 3 & 1 | rr >> 1 & 0x104;
    if (uVar4 == 0) goto LAB_0013ded9;
    bVar6 = (byte)uVar4;
  }
  bVar6 = (byte)(rr >> 0x10) | bVar6 | 0x40;
  if ((xo & XI_GROUP5) == 0xfc) {
    *pbVar3 = bVar6;
    bVar6 = (byte)(xo >> 8);
  }
  else if ((xo & 0xffffff) == 0x6600fd) {
    *pbVar3 = bVar6;
    bVar6 = 0x66;
  }
  pbVar3[-1] = bVar6;
  pbVar3 = pbVar3 + -1;
LAB_0013ded9:
  as->mcp = pbVar3;
  return;
}

Assistant:

static void emit_mrm(ASMState *as, x86Op xo, Reg rr, Reg rb)
{
  MCode *p = as->mcp;
  x86Mode mode = XM_REG;
  if (rb == RID_MRM) {
    rb = as->mrm.base;
    if (rb == RID_NONE) {
      rb = RID_EBP;
      mode = XM_OFS0;
      p -= 4;
      *(int32_t *)p = as->mrm.ofs;
      if (as->mrm.idx != RID_NONE)
	goto mrmidx;
#if LJ_64
      *--p = MODRM(XM_SCALE1, RID_ESP, RID_EBP);
      rb = RID_ESP;
#endif
    } else if (LJ_GC64 && rb == RID_RIP) {
      lj_assertA(as->mrm.idx == RID_NONE, "RIP-rel mrm cannot have index");
      mode = XM_OFS0;
      p -= 4;
      *(int32_t *)p = as->mrm.ofs;
    } else {
      if (as->mrm.ofs == 0 && (rb&7) != RID_EBP) {
	mode = XM_OFS0;
      } else if (checki8(as->mrm.ofs)) {
	*--p = (MCode)as->mrm.ofs;
	mode = XM_OFS8;
      } else {
	p -= 4;
	*(int32_t *)p = as->mrm.ofs;
	mode = XM_OFS32;
      }
      if (as->mrm.idx != RID_NONE) {
      mrmidx:
	as->mcp = emit_opmx(xo, mode, as->mrm.scale, rr, rb, as->mrm.idx, p);
	return;
      }
      if ((rb&7) == RID_ESP)
	*--p = MODRM(XM_SCALE1, RID_ESP, RID_ESP);
    }
  }
  as->mcp = emit_opm(xo, mode, rr, rb, p, 0);
}